

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  Module *this_00;
  size_t sVar3;
  pointer *__ptr;
  Location loc;
  long local_c8;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_c0;
  string_view local_b8;
  string local_a8;
  string_view local_88;
  Var local_78;
  
  local_b8.size_ = field_name.size_;
  local_b8.data_ = field_name.data_;
  local_88.size_ = module_name.size_;
  local_88.data_ = module_name.data_;
  MakeUnique<wabt::FuncImport>();
  string_view::to_string_abi_cxx11_(&local_a8,&local_88);
  std::__cxx11::string::operator=((string *)(local_c8 + 8),(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  string_view::to_string_abi_cxx11_(&local_a8,&local_b8);
  std::__cxx11::string::operator=((string *)(local_c8 + 0x28),(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_a8.field_2._8_4_ = 0;
  local_a8._M_string_length = strlen(pcVar1);
  local_a8._M_dataplus._M_p = pcVar1;
  local_a8.field_2._M_allocated_capacity = OVar2;
  Var::Var(&local_78,sig_index,(Location *)&local_a8);
  SetFuncDeclaration(this,(FuncDeclaration *)(local_c8 + 0x70),&local_78);
  Var::~Var(&local_78);
  this_00 = this->module_;
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar3 = strlen(pcVar1);
  local_c0._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       operator_new(0x48);
  *(long *)((long)local_c0._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_c0._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(char **)((long)local_c0._M_t.
                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
       pcVar1;
  *(size_t *)
   ((long)local_c0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20) = sVar3;
  *(Offset *)
   ((long)local_c0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(undefined4 *)
   ((long)local_c0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_c0._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
  *(undefined ***)
   local_c0._M_t.
   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
   super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       &PTR__ImportModuleField_001c2238;
  *(long *)((long)local_c0._M_t.
                  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                  .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
       local_c8;
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_c0);
  if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      local_c0._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (ImportModuleField *)0x0) {
    (**(code **)(*(long *)local_c0._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    string_view module_name,
                                    string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = MakeUnique<FuncImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  SetFuncDeclaration(&import->func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}